

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writesrc.cpp
# Opt level: O3

void usrc_writeUCPTrie(FILE *f,char *name,UCPTrie *pTrie)

{
  char cVar1;
  uint uVar2;
  char line3 [100];
  char line2 [100];
  char line [100];
  char acStack_178 [112];
  char local_108 [112];
  char local_98 [104];
  
  cVar1 = pTrie->valueWidth;
  if (cVar1 == '\0') {
    uVar2 = 0x10;
  }
  else if (cVar1 == '\x01') {
    uVar2 = 0x20;
  }
  else {
    uVar2 = (uint)(cVar1 == '\x02') << 3;
  }
  sprintf(local_98,"static const uint16_t %s_trieIndex[%%ld]={\n",name);
  sprintf(local_108,"static const uint%d_t %s_trieData[%%ld]={\n",(ulong)uVar2,name);
  usrc_writeUCPTrieArrays(f,local_98,local_108,pTrie,"\n};\n\n");
  sprintf(local_98,"static const UCPTrie %s_trie={\n",name);
  sprintf(local_108,"%s_trieIndex",name);
  sprintf(acStack_178,"%s_trieData",name);
  usrc_writeUCPTrieStruct(f,local_98,pTrie,local_108,acStack_178,"};\n\n");
  return;
}

Assistant:

U_CAPI void U_EXPORT2
usrc_writeUCPTrie(FILE *f, const char *name, const UCPTrie *pTrie) {
    int32_t width=
        pTrie->valueWidth==UCPTRIE_VALUE_BITS_16 ? 16 :
        pTrie->valueWidth==UCPTRIE_VALUE_BITS_32 ? 32 :
        pTrie->valueWidth==UCPTRIE_VALUE_BITS_8 ? 8 : 0;
    char line[100], line2[100], line3[100];
    sprintf(line, "static const uint16_t %s_trieIndex[%%ld]={\n", name);
    sprintf(line2, "static const uint%d_t %s_trieData[%%ld]={\n", (int)width, name);
    usrc_writeUCPTrieArrays(f, line, line2, pTrie, "\n};\n\n");
    sprintf(line, "static const UCPTrie %s_trie={\n", name);
    sprintf(line2, "%s_trieIndex", name);
    sprintf(line3, "%s_trieData", name);
    usrc_writeUCPTrieStruct(f, line, pTrie, line2, line3, "};\n\n");
}